

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O0

void VW::finish_example(vw *all,example *ec)

{
  bool bVar1;
  vw *in_RSI;
  lock_guard<std::mutex> lock;
  example *in_stack_ffffffffffffffe8;
  
  bVar1 = is_ring_example(in_RSI,in_stack_ffffffffffffffe8);
  if (bVar1) {
    clean_example(in_RSI,in_stack_ffffffffffffffe8,false);
    std::lock_guard<std::mutex>::lock_guard
              ((lock_guard<std::mutex> *)in_RSI,(mutex_type *)in_stack_ffffffffffffffe8);
    std::condition_variable::notify_one();
    std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x2f5409);
  }
  return;
}

Assistant:

void finish_example(vw& all, example& ec)
{
  // only return examples to the pool that are from the pool and not externally allocated
  if (!is_ring_example(all, &ec))
    return;

  clean_example(all, ec, false);

  {
    std::lock_guard<std::mutex> lock(all.p->output_lock);
    all.p->output_done.notify_one();
  }
}